

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManMonitor.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::DataManMonitor::AddCompression
          (DataManMonitor *this,string *method,string *accuracyUsed)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  undefined8 uVar3;
  float fVar4;
  char *local_30;
  
  std::__cxx11::string::_M_assign((string *)&this->m_CompressionMethod);
  if (accuracyUsed->_M_string_length == 0) {
    return;
  }
  __nptr = (accuracyUsed->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  fVar4 = strtof(__nptr,&local_30);
  if (local_30 == __nptr) {
    uVar3 = std::__throw_invalid_argument("stof");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    _Unwind_Resume(uVar3);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_00699de5;
    fVar4 = (float)std::__throw_out_of_range("stof");
  }
  *piVar2 = iVar1;
LAB_00699de5:
  this->m_CompressionAccuracy = fVar4;
  return;
}

Assistant:

void DataManMonitor::AddCompression(const std::string &method, const std::string &accuracyUsed)
{
    m_CompressionMethod = method;

    if (!accuracyUsed.empty())
    {
        m_CompressionAccuracy = std::stof(accuracyUsed);
    }
}